

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          BaseTextGenerator *generator)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  double dVar3;
  uint uVar4;
  FastFieldValuePrinter *pFVar5;
  Message *message_00;
  uint64_t uVar6;
  string *this_00;
  EnumDescriptor *this_01;
  EnumValueDescriptor *pEVar7;
  _func_int *UNRECOVERED_JUMPTABLE;
  long *plVar8;
  string *psVar9;
  string *extraout_RAX;
  bool bVar10;
  long *plVar11;
  long lVar12;
  ulong uVar13;
  _Alloc_hider _Var14;
  float fVar15;
  string scratch;
  string truncated_value;
  string local_c0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  bVar2 = field->field_0x1;
  bVar10 = (bool)((bVar2 & 0x20) >> 5);
  if (0xbf < bVar2 == bVar10) {
    psVar9 = (string *)0x0;
  }
  else {
    psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                       (bVar10,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
  }
  if (psVar9 == (string *)0x0) {
    if ((index != -1) && ((field->field_0x1 & 0x20) == 0)) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/text_format.cc"
                 ,0xaba,0x25,"field->is_repeated() || (index == -1)");
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (&local_c0,0x28,"Index must be -1 for non-repeated fields");
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_c0);
    }
    pFVar5 = GetFieldPrinter(this,field);
    if (((field->options_->field_0)._impl_.debug_redact_ == true) &&
       (this->redact_debug_string_ == true)) {
      LOCK();
      (anonymous_namespace)::num_redacted_field = (anonymous_namespace)::num_redacted_field + 1;
      UNLOCK();
      (*generator->_vptr_BaseTextGenerator[5])(generator,"[REDACTED]",10);
      return;
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
    case 1:
      bVar2 = field->field_0x1;
      bVar10 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar10) {
        psVar9 = (string *)0x0;
      }
      else {
        psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                           (bVar10,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
      }
      if (psVar9 == (string *)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          uVar4 = Reflection::GetInt32(reflection,message,field);
        }
        else {
          uVar4 = Reflection::GetRepeatedInt32(reflection,message,field,index);
        }
        UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[3];
LAB_00304085:
        uVar13 = (ulong)uVar4;
LAB_00304111:
        (*UNRECOVERED_JUMPTABLE)(pFVar5,uVar13,generator,UNRECOVERED_JUMPTABLE);
        return;
      }
      goto LAB_003044d5;
    case 2:
      bVar2 = field->field_0x1;
      bVar10 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar10) {
        psVar9 = (string *)0x0;
      }
      else {
        psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                           (bVar10,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
      }
      if (psVar9 == (string *)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          uVar6 = Reflection::GetInt64(reflection,message,field);
        }
        else {
          uVar6 = Reflection::GetRepeatedInt64(reflection,message,field,index);
        }
        UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[5];
LAB_003040a6:
        (*UNRECOVERED_JUMPTABLE)(pFVar5,uVar6,generator,UNRECOVERED_JUMPTABLE);
        return;
      }
      goto LAB_003044e2;
    case 3:
      bVar2 = field->field_0x1;
      bVar10 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar10) {
        psVar9 = (string *)0x0;
      }
      else {
        psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                           (bVar10,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
      }
      if (psVar9 == (string *)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          uVar4 = Reflection::GetUInt32(reflection,message,field);
        }
        else {
          uVar4 = Reflection::GetRepeatedUInt32(reflection,message,field,index);
        }
        UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[4];
        goto LAB_00304085;
      }
      goto LAB_003044ae;
    case 4:
      bVar2 = field->field_0x1;
      bVar10 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar10) {
        psVar9 = (string *)0x0;
      }
      else {
        psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                           (bVar10,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
      }
      if (psVar9 == (string *)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          uVar6 = Reflection::GetUInt64(reflection,message,field);
        }
        else {
          uVar6 = Reflection::GetRepeatedUInt64(reflection,message,field,index);
        }
        UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[6];
        goto LAB_003040a6;
      }
      goto LAB_003044bb;
    case 5:
      bVar2 = field->field_0x1;
      bVar10 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar10) {
        psVar9 = (string *)0x0;
      }
      else {
        psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                           (bVar10,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
      }
      if (psVar9 == (string *)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          dVar3 = Reflection::GetDouble(reflection,message,field);
          fVar15 = SUB84(dVar3,0);
        }
        else {
          dVar3 = Reflection::GetRepeatedDouble(reflection,message,field,index);
          fVar15 = SUB84(dVar3,0);
        }
        UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[8];
LAB_003040da:
        (*UNRECOVERED_JUMPTABLE)(fVar15,pFVar5,generator);
        return;
      }
      goto LAB_00304494;
    case 6:
      bVar2 = field->field_0x1;
      bVar10 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar10) {
        psVar9 = (string *)0x0;
      }
      else {
        psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                           (bVar10,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
      }
      if (psVar9 == (string *)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          fVar15 = Reflection::GetFloat(reflection,message,field);
        }
        else {
          fVar15 = Reflection::GetRepeatedFloat(reflection,message,field,index);
        }
        UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[7];
        goto LAB_003040da;
      }
      goto LAB_003044ef;
    case 7:
      bVar2 = field->field_0x1;
      bVar10 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar10) {
        psVar9 = (string *)0x0;
      }
      else {
        psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                           (bVar10,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
      }
      if (psVar9 == (string *)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          bVar10 = Reflection::GetBool(reflection,message,field);
        }
        else {
          bVar10 = Reflection::GetRepeatedBool(reflection,message,field,index);
        }
        UNRECOVERED_JUMPTABLE = pFVar5->_vptr_FastFieldValuePrinter[2];
        uVar13 = (ulong)bVar10;
        goto LAB_00304111;
      }
      break;
    case 8:
      bVar2 = field->field_0x1;
      bVar10 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar10) {
        psVar9 = (string *)0x0;
      }
      else {
        psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                           (bVar10,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
      }
      if (psVar9 == (string *)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          uVar4 = Reflection::GetEnumValue(reflection,message,field);
        }
        else {
          uVar4 = Reflection::GetRepeatedEnumValue(reflection,message,field,index);
        }
        this_01 = FieldDescriptor::enum_type(field);
        pEVar7 = EnumDescriptor::FindValueByNumber(this_01,uVar4);
        if (pEVar7 != (EnumValueDescriptor *)0x0) {
          (*pFVar5->_vptr_FastFieldValuePrinter[0xb])
                    (pFVar5,(ulong)uVar4,pEVar7->all_names_,generator);
          return;
        }
        paVar1 = &local_c0.field_2;
        lVar12 = absl::lts_20240722::numbers_internal::FastIntToBuffer(uVar4,paVar1->_M_local_buf);
        local_c0._M_dataplus._M_p = (pointer)(lVar12 - (long)paVar1);
        local_c0._M_string_length = (size_type)paVar1;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,paVar1,lVar12);
        (*pFVar5->_vptr_FastFieldValuePrinter[0xb])(pFVar5,(ulong)uVar4,&local_90,generator);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p == &local_90.field_2) {
          return;
        }
        lVar12 = CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                          local_90.field_2._M_local_buf[0]);
        _Var14._M_p = local_90._M_dataplus._M_p;
        goto LAB_003042e4;
      }
      goto LAB_003044c8;
    case 9:
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      local_c0._M_string_length = 0;
      local_c0.field_2._M_local_buf[0] = '\0';
      bVar2 = field->field_0x1;
      bVar10 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar10) {
        psVar9 = (string *)0x0;
      }
      else {
        psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                           (bVar10,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
      }
      if (psVar9 != (string *)0x0) goto LAB_00304509;
      if ((field->field_0x1 & 0x20) == 0) {
        this_00 = Reflection::GetStringReference(reflection,message,field,&local_c0);
      }
      else {
        this_00 = Reflection::GetRepeatedStringReference(reflection,message,field,index,&local_c0);
      }
      paVar1 = &local_90.field_2;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      local_90._M_dataplus._M_p = (pointer)paVar1;
      if ((0 < this->truncate_string_field_longer_than_) &&
         ((ulong)this->truncate_string_field_longer_than_ < this_00->_M_string_length)) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)this_00);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_50);
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_60 = *plVar11;
          lStack_58 = plVar8[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar11;
          local_70 = (long *)*plVar8;
        }
        local_68 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        this_00 = &local_90;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      bVar2 = field->type_;
      lVar12 = 0x48;
      if (bVar2 != 9) {
        if (bVar2 == 0xc) {
          psVar9 = (string *)0x0;
        }
        else {
          psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             ((ulong)bVar2,0xc,"field->type() == FieldDescriptor::TYPE_BYTES");
        }
        lVar12 = 0x50;
        if (psVar9 != (string *)0x0) {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_70,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/text_format.cc"
                     ,0xae9,*(undefined8 *)(psVar9 + 8),*(undefined8 *)psVar9);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_70);
        }
      }
      (**(code **)((long)pFVar5->_vptr_FastFieldValuePrinter + lVar12))(pFVar5,this_00,generator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
        return;
      }
      lVar12 = CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                        local_c0.field_2._M_local_buf[0]);
      _Var14._M_p = local_c0._M_dataplus._M_p;
LAB_003042e4:
      operator_delete(_Var14._M_p,lVar12 + 1);
switchD_00303ce2_default:
      return;
    case 10:
      bVar2 = field->field_0x1;
      bVar10 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar10) {
        psVar9 = (string *)0x0;
      }
      else {
        psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                           (bVar10,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
      }
      if (psVar9 == (string *)0x0) {
        if ((field->field_0x1 & 0x20) == 0) {
          message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
        }
        else {
          message_00 = Reflection::GetRepeatedMessage(reflection,message,field,index);
        }
        Print(this,message_00,generator);
        return;
      }
      goto LAB_003044a1;
    default:
      goto switchD_00303ce2_default;
    }
  }
  else {
    PrintFieldValue();
LAB_00304494:
    PrintFieldValue();
LAB_003044a1:
    PrintFieldValue();
LAB_003044ae:
    PrintFieldValue();
LAB_003044bb:
    PrintFieldValue();
LAB_003044c8:
    PrintFieldValue();
LAB_003044d5:
    PrintFieldValue();
LAB_003044e2:
    PrintFieldValue();
LAB_003044ef:
    PrintFieldValue();
  }
  PrintFieldValue();
  psVar9 = extraout_RAX;
LAB_00304509:
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
             ,0xab7,*(undefined8 *)(psVar9 + 8),*(undefined8 *)psVar9);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_90);
}

Assistant:

void TextFormat::Printer::PrintFieldValue(const Message& message,
                                          const Reflection* reflection,
                                          const FieldDescriptor* field,
                                          int index,
                                          BaseTextGenerator* generator) const {
  ABSL_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);
  if (TryRedactFieldValue(message, field, generator,
                          /*insert_value_separator=*/false)) {
    return;
  }

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                           \
    printer->Print##METHOD(                                          \
        field->is_repeated()                                         \
            ? reflection->GetRepeated##METHOD(message, field, index) \
            : reflection->Get##METHOD(message, field),               \
        generator);                                                  \
    break

    OUTPUT_FIELD(INT32, Int32);
    OUTPUT_FIELD(INT64, Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD(FLOAT, Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(BOOL, Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      std::string scratch;
      const std::string& value =
          field->is_repeated()
              ? reflection->GetRepeatedStringReference(message, field, index,
                                                       &scratch)
              : reflection->GetStringReference(message, field, &scratch);
      const std::string* value_to_print = &value;
      std::string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          static_cast<size_t>(truncate_string_field_longer_than_) <
              value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        printer->PrintString(*value_to_print, generator);
      } else {
        ABSL_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        printer->PrintBytes(*value_to_print, generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value =
          field->is_repeated()
              ? reflection->GetRepeatedEnumValue(message, field, index)
              : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != nullptr) {
        printer->PrintEnum(enum_value, internal::NameOfEnumAsString(enum_desc),
                           generator);
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        printer->PrintEnum(enum_value, absl::StrCat(enum_value), generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
                ? reflection->GetRepeatedMessage(message, field, index)
                : reflection->GetMessage(message, field),
            generator);
      break;
  }
}